

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
Chunk::serialize(vector<char,_std::allocator<char>_> *__return_storage_ptr__,Chunk *this)

{
  TileData TVar1;
  bool bVar2;
  uint i;
  long lVar3;
  allocator_type local_11;
  
  bVar2 = isEmpty(this);
  if (bVar2) {
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,0x1000,&local_11);
    for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 1) {
      TVar1 = this->tiles_[lVar3];
      *(uint *)((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start + lVar3 * 4) =
           (uint)TVar1 >> 0x18 | ((uint)TVar1 & 0xff0000) >> 8 | ((uint)TVar1 & 0xff00) << 8 |
           (int)TVar1 << 0x18;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> Chunk::serialize() const {
    if (isEmpty()) {
        return {};
    }
    std::vector<char> data(sizeof(tiles_));
    for (unsigned int i = 0; i < WIDTH * WIDTH; ++i) {
        // FIXME: it may be just as efficient to create tileSwapped with bitwise ops instead of relying on a fragile reinterpret cast (which could be platform dependent).
        uint32_t tileSwapped = FileStorage::byteswap(*reinterpret_cast<const uint32_t*>(tiles_ + i));
        std::memcpy(data.data() + i * sizeof(TileData), &tileSwapped, sizeof(TileData));
    }
    return data;
}